

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

void __thiscall QList<QString>::QList(QList<QString> *this,qsizetype size)

{
  QString *__s;
  long in_FS_OFFSET;
  QArrayData *d;
  QArrayData *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  __s = (QString *)QArrayData::allocate(&local_28,0x18,0x10,size,KeepSize);
  (this->d).d = (Data *)local_28;
  (this->d).ptr = __s;
  (this->d).size = 0;
  if (size != 0) {
    memset(__s,0,((size * 0x18 - 0x18U) / 0x18) * 0x18 + 0x18);
    (this->d).size = size;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit QList(qsizetype size)
        : d(size)
    {
        if (size)
            d->appendInitialize(size);
    }